

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O2

ProgramSources * deqp::gles3::Performance::anon_unknown_0::Utils::getArithmeticWorkloadShader(void)

{
  ProgramSources *in_RDI;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  (anonymous_namespace)::Utils::getBaseVertexShader_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "#version 300 es\nin mediump vec3 v_bcoords;\nout mediump vec4 fragColor;\nuniform mediump int u_iterations;\nvoid main()\n{\n\tmediump float d = gl_FragCoord.z;\n\tfor (int i = 0; i<u_iterations; i++)\n\t\td = d*sin(d)*sin(d) + d*cos(d)*cos(d);\n\tif (v_bcoords.x < 0.02 || v_bcoords.y < 0.02 || v_bcoords.z < 0.02)\n\t\tfragColor = vec4(1,d,d,1);\n\telse\n\t\tfragColor = vec4(d,0,0,1);\n}\n"
             ,&local_49);
  glu::makeVtxFragSources(in_RDI,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return in_RDI;
}

Assistant:

glu::ProgramSources getArithmeticWorkloadShader (void)
	{
		return glu::makeVtxFragSources(getBaseVertexShader(), getArithmeticWorkloadFragmentShader());
	}